

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_substring_indexBeyondBounds_fn(int _i)

{
  AString string_00;
  int iVar1;
  AString *pAVar2;
  char *in_stack_fffffffffffffe10;
  uintmax_t _ck_y_11;
  uintmax_t _ck_x_17;
  char *_ck_y_q_3;
  char *_ck_x_q_3;
  char *_ck_y_s_3;
  char *_ck_x_s_3;
  char *_ck_y_10;
  char *_ck_x_16;
  void *_ck_x_15;
  uintmax_t _ck_y_9;
  uintmax_t _ck_x_14;
  uintmax_t _ck_y_8;
  uintmax_t _ck_x_13;
  char *_ck_y_q_2;
  char *_ck_x_q_2;
  char *_ck_y_s_2;
  char *_ck_x_s_2;
  char *_ck_y_7;
  char *_ck_x_12;
  void *_ck_x_11;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_10;
  void *_ck_x_9;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_8;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_4;
  char *_ck_x_7;
  void *_ck_x_6;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_5;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_4;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_3;
  void *_ck_x_2;
  uintmax_t _ck_y;
  uintmax_t _ck_x_1;
  void *_ck_x;
  AString *substring;
  AString string;
  int _i_local;
  
  string.buffer._4_4_ = _i;
  private_ACUtilsTest_AString_constructTestString((AString *)&substring,"xxxx01234567xxxx",0x10);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  pAVar2 = AString_substring((AString *)&substring,0x10,0xffffffffffffffff);
  if (pAVar2 == (AString *)0x0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9bd,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) substring != NULL",
                      "(void*) substring",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9bd);
  if (pAVar2->capacity != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9be,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(*substring).capacity == (8)"
                      ,"(*substring).capacity",pAVar2->capacity,"(8)",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9be);
  if (pAVar2->buffer == (char *)0x0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9be,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (*substring).buffer != NULL",
                      "(void*) (*substring).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9be);
  _ck_y_s = pAVar2->buffer;
  if (_ck_y_s == (char *)0x0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar1 = strcmp("",_ck_y_s);
    if (iVar1 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9be);
      if (pAVar2->size != 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9be,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(*substring).size == strlen(\"\")","(*substring).size",pAVar2->size,
                          "strlen(\"\")",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9be);
      if (string.size != 0x10) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9bf,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).capacity == (16)","(string).capacity",string.size,"(16)",0x10,0)
        ;
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9bf);
      if (string.capacity == 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9bf,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                          "(void*) (string).buffer",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9bf);
      _ck_y_s_1 = (char *)string.capacity;
      if (string.capacity == 0) {
        _ck_y_q_1 = "";
        _ck_y_s_1 = "(null)";
      }
      else {
        _ck_y_q_1 = "\"";
        iVar1 = strcmp("xxxx01234567xxxx",(char *)string.capacity);
        if (iVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9bf);
          if (string.deallocator != (ACUtilsDeallocator)0x10) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9bf,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(string).size == strlen(\"xxxx01234567xxxx\")","(string).size",
                              string.deallocator,"strlen(\"xxxx01234567xxxx\")",0x10,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9bf);
          AString_destruct(pAVar2);
          pAVar2 = AString_substring((AString *)&substring,0xffffffffffffffff,4);
          if (pAVar2 == (AString *)0x0) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9c2,"Assertion \'_ck_x != NULL\' failed",
                              "Assertion \'%s\' failed: %s == %#x","(void*) substring != NULL",
                              "(void*) substring",0,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9c2);
          if (pAVar2->capacity != 8) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9c3,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(*substring).capacity == (8)","(*substring).capacity",
                              pAVar2->capacity,"(8)",8,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9c3);
          if (pAVar2->buffer != (char *)0x0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9c3);
            _ck_y_s_2 = pAVar2->buffer;
            if (_ck_y_s_2 == (char *)0x0) {
              _ck_y_q_2 = "";
              _ck_y_s_2 = "(null)";
            }
            else {
              _ck_y_q_2 = "\"";
              iVar1 = strcmp("",_ck_y_s_2);
              if (iVar1 == 0) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x9c3);
                if (pAVar2->size != 0) {
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0x9c3,"Assertion \'_ck_x == _ck_y\' failed",
                                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                    "(*substring).size == strlen(\"\")","(*substring).size",
                                    pAVar2->size,"strlen(\"\")",0,0);
                }
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x9c3);
                if (string.size == 0x10) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9c4);
                  if (string.capacity == 0) {
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9c4,"Assertion \'_ck_x != NULL\' failed",
                                      "Assertion \'%s\' failed: %s == %#x",
                                      "(void*) (string).buffer != NULL","(void*) (string).buffer",0,
                                      0);
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9c4);
                  _ck_y_s_3 = (char *)string.capacity;
                  if (string.capacity == 0) {
                    _ck_y_q_3 = "";
                    _ck_y_s_3 = "(null)";
                  }
                  else {
                    _ck_y_q_3 = "\"";
                    iVar1 = strcmp("xxxx01234567xxxx",(char *)string.capacity);
                    if (iVar1 == 0) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x9c4);
                      if (string.deallocator == (ACUtilsDeallocator)0x10) {
                        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0x9c4);
                        AString_destruct(pAVar2);
                        string_00.deallocator = string.deallocator;
                        string_00.reallocator = string.reallocator;
                        string_00.size = string.size;
                        string_00.capacity = string.capacity;
                        string_00.buffer = in_stack_fffffffffffffe10;
                        private_ACUtilsTest_AString_destructTestString(string_00);
                        return;
                      }
                      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x9c4,"Assertion \'_ck_x == _ck_y\' failed",
                                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                        "(string).size == strlen(\"xxxx01234567xxxx\")",
                                        "(string).size",string.deallocator,
                                        "strlen(\"xxxx01234567xxxx\")",0x10,0);
                    }
                  }
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0x9c4,
                                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                    "(string).buffer == (\"xxxx01234567xxxx\")","(string).buffer",
                                    _ck_y_q_3,_ck_y_s_3,_ck_y_q_3,"(\"xxxx01234567xxxx\")","\"",
                                    "xxxx01234567xxxx","\"",0);
                }
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x9c4,"Assertion \'_ck_x == _ck_y\' failed",
                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                  "(string).capacity == (16)","(string).capacity",string.size,"(16)"
                                  ,0x10,0);
              }
            }
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9c3,
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                              "(*substring).buffer == (\"\")","(*substring).buffer",_ck_y_q_2,
                              _ck_y_s_2,_ck_y_q_2,"(\"\")","\"","","\"",0);
          }
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x9c3,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x",
                            "(void*) (*substring).buffer != NULL","(void*) (*substring).buffer",0,0)
          ;
        }
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9bf,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(string).buffer == (\"xxxx01234567xxxx\")","(string).buffer",_ck_y_q_1,
                        _ck_y_s_1,_ck_y_q_1,"(\"xxxx01234567xxxx\")","\"","xxxx01234567xxxx","\"",0)
      ;
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x9be,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(*substring).buffer == (\"\")","(*substring).buffer",_ck_y_q,_ck_y_s,_ck_y_q,
                    "(\"\")","\"","","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_substring_indexBeyondBounds)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("xxxx01234567xxxx", 16);
    struct AString *substring;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    substring = AString_substring(&string, 16, -1);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "xxxx01234567xxxx", 16);
    AString_destruct(substring);
    substring = AString_substring(&string, -1, 4);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "xxxx01234567xxxx", 16);
    AString_destruct(substring);
    private_ACUtilsTest_AString_destructTestString(string);
}